

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O1

SP __thiscall pbrt::SemanticParser::createMaterial_mirror(SemanticParser *this,SP *in)

{
  element_type *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  runtime_error *prVar5;
  long *plVar6;
  element_type *peVar7;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  undefined1 auVar11 [16];
  SP SVar12;
  SP mat;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  element_type *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  undefined1 local_e8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  string local_c0;
  SemanticParser *local_a0;
  SP *local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  local_90;
  undefined1 local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_f8 = (element_type *)0x0;
  local_a0 = this;
  local_98 = in;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pbrt::MirrorMaterial,std::allocator<pbrt::MirrorMaterial>,std::__cxx11::string&>
            (&_Stack_f0,(MirrorMaterial **)&local_f8,(allocator<pbrt::MirrorMaterial> *)&local_90,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(*in_RDX + 0x60));
  std::__shared_ptr<pbrt::MirrorMaterial,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<pbrt::MirrorMaterial,pbrt::MirrorMaterial>
            ((__shared_ptr<pbrt::MirrorMaterial,(__gnu_cxx::_Lock_policy)2> *)&local_f8,
             (MirrorMaterial *)local_f8);
  p_Var9 = *(_Rb_tree_node_base **)(*in_RDX + 0x18);
  p_Var10 = (_Rb_tree_node_base *)(*in_RDX + 8);
  _Var8._M_pi = extraout_RDX;
  if (p_Var9 != p_Var10) {
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
      ::pair(&local_90,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
              *)(p_Var9 + 1));
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,local_90.first._M_dataplus._M_p,
                 local_90.first._M_dataplus._M_p +
                 (long)(_Rb_tree_color *)local_90.first._M_string_length);
      iVar4 = std::__cxx11::string::compare((char *)&local_c0);
      if (iVar4 == 0) {
        bVar3 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&local_c0);
        if (bVar3) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar5,"mapping Kr for mirror materials not implemented");
          __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        syntactic::ParamSet::getParam3f
                  ((ParamSet *)*in_RDX,
                   (float *)&(local_f8->film).
                             super___shared_ptr<pbrt::Film,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   &local_c0);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_c0);
        if (iVar4 == 0) {
          syntactic::ParamSet::getParamTexture((ParamSet *)local_60,(string *)*in_RDX);
          findOrCreateTexture((SemanticParser *)local_e8,(SP *)local_98);
          uVar2 = local_e8._8_8_;
          uVar1 = local_e8._0_8_;
          local_e8._0_8_ = (element_type *)0x0;
          local_e8._8_8_ = (element_type *)0x0;
          this_00 = (local_f8->integrator).
                    super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (local_f8->sampler).super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1;
          (local_f8->integrator).super___shared_ptr<pbrt::Integrator,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)uVar2;
          if (this_00 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
          }
          if ((element_type *)local_e8._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
          }
          if ((_Base_ptr)local_60._8_8_ != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
          }
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&local_c0);
          if (iVar4 != 0) {
            prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_50,"un-handled mirror-material parameter \'",&local_90.first);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
            local_e8._0_8_ = *plVar6;
            peVar7 = (element_type *)(plVar6 + 2);
            if ((element_type *)local_e8._0_8_ == peVar7) {
              local_e8._16_8_ = (peVar7->super_Entity)._vptr_Entity;
              _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar6[3];
              local_e8._0_8_ = (element_type *)(local_e8 + 0x10);
            }
            else {
              local_e8._16_8_ = (peVar7->super_Entity)._vptr_Entity;
            }
            local_e8._8_8_ = plVar6[1];
            *plVar6 = (long)peVar7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            std::runtime_error::runtime_error(prVar5,(string *)local_e8);
            __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if (local_90.second.super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_90.second.
                   super___shared_ptr<pbrt::syntactic::Param,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
        operator_delete(local_90.first._M_dataplus._M_p,
                        local_90.first.field_2._M_allocated_capacity + 1);
      }
      auVar11 = std::_Rb_tree_increment(p_Var9);
      _Var8._M_pi = auVar11._8_8_;
      p_Var9 = auVar11._0_8_;
    } while (p_Var9 != p_Var10);
  }
  (local_a0->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (local_a0->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_f8;
  (local_a0->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_f0._M_pi;
  SVar12.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var8._M_pi;
  SVar12.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_a0;
  return (SP)SVar12.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Material::SP SemanticParser::createMaterial_mirror(pbrt::syntactic::Material::SP in)
  {
    MirrorMaterial::SP mat = std::make_shared<MirrorMaterial>(in->name);
    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "Kr") {
        if (in->hasParamTexture(name)) {
          throw std::runtime_error("mapping Kr for mirror materials not implemented");
        } else
          in->getParam3f(&mat->kr.x,name);
      }
      else if (name == "bumpmap") {
        mat->map_bump = findOrCreateTexture(in->getParamTexture(name));
      }
      else if (name == "type") {
        /* ignore */
      } else
        throw std::runtime_error("un-handled mirror-material parameter '"+it.first+"'");
    };
    return mat;
  }